

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::r_formatter<spdlog::details::null_scoped_padder>::format
          (r_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  string_view_t view;
  memory_buf_t *in_RCX;
  tm *in_RDX;
  memory_buf_t *in_RSI;
  long in_RDI;
  null_scoped_padder p;
  size_t field_size;
  char *in_stack_ffffffffffffffb8;
  buffer<char> *in_stack_ffffffffffffffc0;
  basic_string_view<char> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  null_scoped_padder in_stack_ffffffffffffffd7;
  char *pcVar4;
  int n;
  
  pcVar4 = (char *)0xb;
  null_scoped_padder::null_scoped_padder
            ((null_scoped_padder *)&stack0xffffffffffffffd7,0xb,(padding_info *)(in_RDI + 8),in_RCX)
  ;
  n = (int)((ulong)in_RDI >> 0x20);
  to12h(in_RDX);
  fmt_helper::pad2(n,in_RSI);
  uVar3 = 0x3a;
  ::fmt::v11::detail::buffer<char>::push_back(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  fmt_helper::pad2(n,in_RSI);
  uVar2 = 0x3a;
  ::fmt::v11::detail::buffer<char>::push_back(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  fmt_helper::pad2(n,in_RSI);
  uVar1 = 0x20;
  ::fmt::v11::detail::buffer<char>::push_back(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  ampm(in_RDX);
  ::fmt::v11::basic_string_view<char>::basic_string_view
            (in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0);
  view.size_ = (size_t)in_RCX;
  view.data_ = pcVar4;
  fmt_helper::append_string_view
            (view,(memory_buf_t *)
                  CONCAT17(in_stack_ffffffffffffffd7,
                           CONCAT16(uVar3,CONCAT15(uVar2,CONCAT14(uVar1,in_stack_ffffffffffffffd0)))
                          ));
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 11;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(to12h(tm_time), dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }